

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryTextureLevelState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int level,
               GLenum pname,QueriedState *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  float *pfVar5;
  QueriedState local_98;
  undefined1 local_6c [8];
  StateQueryMemoryWriteGuard<float> value_1;
  undefined1 local_34 [8];
  StateQueryMemoryWriteGuard<int> value;
  GLenum pname_local;
  int level_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  value.m_value = pname;
  value.m_postguard = level;
  if (type == QUERY_TEXTURE_LEVEL_INTEGER) {
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_34);
    iVar2 = value.m_postguard;
    iVar1 = value.m_value;
    piVar4 = StateQueryMemoryWriteGuard<int>::operator&((StateQueryMemoryWriteGuard<int> *)local_34)
    ;
    glu::CallLogWrapper::glGetTexLevelParameteriv(gl,target,iVar2,iVar1,piVar4);
    bVar3 = checkError(result,gl,"glGetTexLevelParameteriv");
    if ((bVar3) &&
       (bVar3 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_34,result), bVar3)) {
      piVar4 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_34);
      QueriedState::QueriedState((QueriedState *)&value_1.m_value,*piVar4);
      memcpy(state,&value_1.m_value,0x28);
    }
  }
  else if (type == QUERY_TEXTURE_LEVEL_FLOAT) {
    StateQueryMemoryWriteGuard<float>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float> *)local_6c);
    iVar2 = value.m_postguard;
    iVar1 = value.m_value;
    pfVar5 = StateQueryMemoryWriteGuard<float>::operator&
                       ((StateQueryMemoryWriteGuard<float> *)local_6c);
    glu::CallLogWrapper::glGetTexLevelParameterfv(gl,target,iVar2,iVar1,pfVar5);
    bVar3 = checkError(result,gl,"glGetTexLevelParameterfv");
    if ((bVar3) &&
       (bVar3 = StateQueryMemoryWriteGuard<float>::verifyValidity
                          ((StateQueryMemoryWriteGuard<float> *)local_6c,result), bVar3)) {
      pfVar5 = StateQueryMemoryWriteGuard::operator_cast_to_float_
                         ((StateQueryMemoryWriteGuard *)local_6c);
      QueriedState::QueriedState(&local_98,*pfVar5);
      memcpy(state,&local_98,0x28);
    }
  }
  return;
}

Assistant:

void queryTextureLevelState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int level, glw::GLenum pname, QueriedState& state)
{
	switch (type)
	{
		case QUERY_TEXTURE_LEVEL_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetTexLevelParameteriv(target, level, pname, &value);

			if (!checkError(result, gl, "glGetTexLevelParameteriv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_TEXTURE_LEVEL_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetTexLevelParameterfv(target, level, pname, &value);

			if (!checkError(result, gl, "glGetTexLevelParameterfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}